

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeKeyRoomAction.cpp
# Opt level: O2

void __thiscall
ThreeKeyRoomAction::pickUpItem(ThreeKeyRoomAction *this,itemType *item,string *information)

{
  ItemWrapper *pIVar1;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pIVar1 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,item);
  ItemWrapper::setLocation(pIVar1,BACKPACK);
  pIVar1 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,item);
  ItemWrapper::getItemName_abi_cxx11_(&sStack_58,pIVar1);
  std::operator+(&local_38,"You pick up the ",&sStack_58);
  std::__cxx11::string::operator=((string *)information,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

void ThreeKeyRoomAction::pickUpItem(const itemType &item, std::string &information) const {
    itemList->getValue(item)->setLocation(BACKPACK);
    information = "You pick up the " + itemList->getValue(item)->getItemName();
}